

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O0

bool __thiscall Clasp::SatElite::doPreprocess(SatElite *this)

{
  bool bVar1;
  uint32 uVar2;
  size_type sVar3;
  time_t tVar4;
  long lVar5;
  SatElite *this_00;
  size_type sVar6;
  SatElite *in_RDI;
  SatElite *unaff_retaddr;
  uint32 end_1;
  uint32 i_1;
  uint32 end;
  uint32 i;
  SatElite *in_stack_00000088;
  uint local_34;
  uint uVar7;
  uint32 local_14;
  undefined1 in_stack_fffffffffffffffb;
  uint32 in_stack_fffffffffffffffc;
  
  local_14 = 0;
  uVar2 = SatPreprocessor::numClauses((SatPreprocessor *)0x249880);
  for (; local_14 != uVar2; local_14 = local_14 + 1) {
    attach(unaff_retaddr,in_stack_fffffffffffffffc,(bool)in_stack_fffffffffffffffb);
  }
  if (((ulong)*(in_RDI->super_SatPreprocessor).opts_ >> 0xd & 0xfff) == 0) {
    lVar5 = std::numeric_limits<long>::max();
  }
  else {
    tVar4 = time((time_t *)0x0);
    lVar5 = tVar4 + (ulong)((uint)((ulong)*(in_RDI->super_SatPreprocessor).opts_ >> 0xd) & 0xfff);
  }
  in_RDI->timeout_ = lVar5;
  uVar7 = 0;
  if (((ulong)*(in_RDI->super_SatPreprocessor).opts_ >> 2 & 0x7ff) == 0) {
    local_34 = 0xffffffff;
  }
  else {
    local_34 = (uint)((ulong)*(in_RDI->super_SatPreprocessor).opts_ >> 2) & 0x7ff;
  }
  while( true ) {
    sVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->queue_);
    this_00 = (SatElite *)(ulong)sVar3;
    sVar6 = bk_lib::indexed_priority_queue<Clasp::SatElite::LessOccCost>::size
                      ((indexed_priority_queue<Clasp::SatElite::LessOccCost> *)0x249983);
    uVar2 = (uint32)((ulong)lVar5 >> 0x20);
    if ((long)&(this_00->super_SatPreprocessor)._vptr_SatPreprocessor + sVar6 == 0) break;
    bVar1 = backwardSubsume(in_stack_00000088);
    if (!bVar1) {
      return false;
    }
    bVar1 = timeout(this_00);
    uVar2 = (uint32)((ulong)lVar5 >> 0x20);
    if ((bVar1) || (uVar7 == local_34)) break;
    bVar1 = eliminateVars(in_RDI);
    if (!bVar1) {
      return false;
    }
    uVar7 = uVar7 + 1;
  }
  reportProgress((SatElite *)CONCAT44(uVar7,local_34),(EventOp)((ulong)in_RDI >> 0x20),
                 (uint32)in_RDI,uVar2);
  return true;
}

Assistant:

bool SatElite::doPreprocess() {
	// 1. add clauses to occur lists
	for (uint32 i  = 0, end = numClauses(); i != end; ++i) {
		attach(i, true);
	}
	// 2. remove subsumed clauses, eliminate vars by clause distribution
	timeout_ = opts_->limTime ? time(0) + opts_->limTime : std::numeric_limits<std::time_t>::max();
	for (uint32 i = 0, end = opts_->limIters ? opts_->limIters : UINT32_MAX; queue_.size()+elimHeap_.size() > 0; ++i) {
		if (!backwardSubsume())   { return false; }
		if (timeout() || i == end){ break;        }
		if (!eliminateVars())     { return false; }
	}
	reportProgress(Progress::event_algorithm, 100,100);
	return true;
}